

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O3

int read_basic_type(coda_cursor *cursor,void *dst,long size_boundary)

{
  coda_type_class cVar1;
  undefined4 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  coda_backend cVar9;
  size_t __n;
  uchar *v;
  int iVar10;
  char *message;
  coda_dynamic_type_struct *pcVar11;
  coda_dynamic_type_struct *pcVar12;
  undefined1 auVar13 [16];
  
  lVar8 = (long)cursor->n;
  pcVar12 = cursor->stack[lVar8 + -1].type;
  cVar9 = pcVar12[1].backend;
  iVar7 = 0;
  if (cVar9 == coda_backend_ascii) {
    pcVar12 = cursor->stack[lVar8 + -2].type;
    iVar7 = (int)cursor->stack[lVar8 + -1].index;
    cVar9 = pcVar12[1].backend;
  }
  if (cVar9 != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x193,"int read_basic_type(const coda_cursor *, void *, long)");
  }
  pcVar11 = *(coda_dynamic_type_struct **)(pcVar12 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar12 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar11 = pcVar12;
  }
  iVar10 = *(int *)((long)&pcVar12[2].definition + 4);
  lVar8 = *(long *)(*(long *)(pcVar12 + 4) + (long)(iVar7 / iVar10) * 8);
  if (lVar8 < 0) {
    message = "Missing record not supported for CDF variable";
LAB_00186e70:
    coda_set_error(-200,message);
    iVar7 = -1;
  }
  else {
    cVar1 = pcVar11->definition->type_class;
    cVar9 = pcVar12[3].backend;
    lVar8 = lVar8 + (int)((iVar7 % iVar10) * cVar9);
    __n = size_boundary & 0xffffffff;
    if ((int)cVar9 <= size_boundary) {
      __n = (size_t)cVar9;
    }
    if (size_boundary < 0) {
      __n = (size_t)cVar9;
    }
    if ((pcVar12[4].definition == (coda_type *)0x0) || ((int)__n < 1)) {
      iVar7 = read_bytes((coda_product *)cursor->product[1].filename,lVar8,(long)(int)__n,dst);
      if (iVar7 != 0) {
        return -1;
      }
    }
    else {
      if ((int)(cVar9 * iVar10 * *(int *)&pcVar12[2].definition) < lVar8) {
        message = "Offset too large in accessing data of CDF variable";
        goto LAB_00186e70;
      }
      memcpy(dst,(void *)((long)&(pcVar12[4].definition)->format + lVar8),__n);
    }
    iVar10 = 0;
    iVar7 = 0;
    if ((cVar1 != coda_text_class) && (iVar7 = iVar10, *(int *)&cursor->product[1].field_0x14 == 0))
    {
      switch(pcVar12[3].backend) {
      case coda_backend_binary:
        break;
      case 2:
        *(ushort *)dst = *dst << 8 | *dst >> 8;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                      ,0x1d3,"int read_basic_type(const coda_cursor *, void *, long)");
      case 4:
        uVar2 = *dst;
        auVar13 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar2 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >>
                                                  0x20),uVar2) >> 0x18),(char)((uint)uVar2 >> 8)),
                                   (ushort)(byte)uVar2) & 0xffffff00ffffff);
        auVar13 = pshuflw(auVar13,auVar13,0x1b);
        sVar3 = auVar13._0_2_;
        sVar4 = auVar13._2_2_;
        sVar5 = auVar13._4_2_;
        sVar6 = auVar13._6_2_;
        *(uint *)dst = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar13[6] - (0xff < sVar6),
                                CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar13[4] - (0xff < sVar5)
                                         ,CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar13[2] -
                                                   (0xff < sVar4),
                                                   (0 < sVar3) * (sVar3 < 0x100) * auVar13[0] -
                                                   (0xff < sVar3))));
        break;
      case 8:
        swap8(dst);
      }
    }
  }
  return iVar7;
}

Assistant:

static int read_basic_type(const coda_cursor *cursor, void *dst, long size_boundary)
{
    coda_netcdf_basic_type *type;
    coda_netcdf_product *product;
    int64_t offset;
    int64_t byte_size;

    type = (coda_netcdf_basic_type *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;
    offset = type->offset;
    byte_size = type->definition->bit_size >> 3;

    if (cursor->stack[cursor->n - 2].type->backend == coda_backend_netcdf &&
        cursor->stack[cursor->n - 2].type->definition->type_class == coda_array_class)
    {
        if (type->record_var)
        {
            coda_netcdf_array *array = (coda_netcdf_array *)cursor->stack[cursor->n - 2].type;
            long num_sub_elements;
            long record_index;

            num_sub_elements = array->definition->num_elements / array->definition->dim[0];
            record_index = cursor->stack[cursor->n - 1].index / num_sub_elements;
            /* jump to record */
            offset += record_index * product->record_size;
            /* jump to sub element in record */
            offset += (cursor->stack[cursor->n - 1].index - record_index * num_sub_elements) * byte_size;
        }
        else
        {
            offset += cursor->stack[cursor->n - 1].index * byte_size;
        }
    }

    if (size_boundary >= 0 && byte_size > size_boundary)
    {
        if (read_bytes(product->raw_product, offset, size_boundary, dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(product->raw_product, offset, byte_size, dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    if (type->definition->type_class == coda_integer_class || type->definition->type_class == coda_real_class)
    {
        switch (type->definition->bit_size)
        {
            case 8:
                /* no endianness conversion needed */
                break;
            case 16:
                swap2(dst);
                break;
            case 32:
                swap4(dst);
                break;
            case 64:
                swap8(dst);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
#endif

    return 0;
}